

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O2

void __thiscall BinarySearchTree::caseC(BinarySearchTree *this,Node *par,Node *loc)

{
  Node *pNVar1;
  Node *loc_00;
  Node *par_00;
  
  pNVar1 = loc->rightChild;
  loc_00 = loc;
  do {
    par_00 = loc_00;
    loc_00 = pNVar1;
    pNVar1 = loc_00->leftChild;
  } while (loc_00->leftChild != (Node *)0x0);
  if (loc_00->rightChild == (Node *)0x0) {
    (&par_00->leftChild)[par_00->leftChild != loc_00] = (Node *)0x0;
  }
  else {
    caseB(this,par_00,loc_00);
  }
  if (par != (Node *)0x0) {
    this = (BinarySearchTree *)&par->rightChild;
    if (par->leftChild == loc) {
      this = (BinarySearchTree *)&par->leftChild;
    }
  }
  *this = (BinarySearchTree)loc_00;
  pNVar1 = loc->rightChild;
  loc_00->leftChild = loc->leftChild;
  loc_00->rightChild = pNVar1;
  return;
}

Assistant:

void BinarySearchTree::caseC(Node *par, Node *loc) {
    Node *ptr, *ptrSave, *suc, *parSuc;
    ptrSave = loc;
    ptr = loc->rightChild;
    while (ptr->leftChild != nullptr) {
        ptrSave = ptr;
        ptr = ptr->leftChild;
    }
    suc = ptr;
    parSuc = ptrSave;
    if (suc->leftChild == nullptr && suc->rightChild == nullptr) {
        caseA(parSuc, suc);
    } else {
        caseB(parSuc, suc);
    }
    if (par == nullptr) {
        root = suc;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = suc;
        } else {
            par->rightChild = suc;
        }
    }
    suc->leftChild = loc->leftChild;
    suc->rightChild = loc->rightChild;
}